

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

uint8_t get_superres_denom_for_qindex(AV1_COMP *cpi,int qindex,int sr_kf,int sr_arf)

{
  int iVar1;
  GF_GROUP *gf_group_00;
  int in_ECX;
  int in_EDX;
  AV1_COMP *in_RDI;
  int denom;
  double energy_by_q2_thresh;
  double energy [16];
  GF_GROUP *gf_group;
  double *in_stack_000001c8;
  AV1_COMP *in_stack_000001d0;
  byte local_b8;
  byte local_b4;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  byte local_1;
  
  gf_group_00 = &in_RDI->ppi->gf_group;
  if ((gf_group_00->update_type[in_RDI->gf_frame_index] == '\0') ||
     (gf_group_00->update_type[in_RDI->gf_frame_index] == '\x03')) {
    if ((gf_group_00->update_type[in_RDI->gf_frame_index] == '\0') && (in_EDX == 0)) {
      local_1 = 8;
    }
    else if ((gf_group_00->update_type[in_RDI->gf_frame_index] == '\x03') && (in_ECX == 0)) {
      local_1 = 8;
    }
    else {
      analyze_hor_freq(in_stack_000001d0,in_stack_000001c8);
      get_energy_by_q2_thresh(gf_group_00,&in_RDI->rc,(uint)in_RDI->gf_frame_index);
      local_b4 = get_superres_denom_from_qindex_energy
                           (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      iVar1 = av1_superres_in_recode_allowed(in_RDI);
      if (iVar1 != 0) {
        local_b8 = local_b4;
        if (local_b4 < 10) {
          local_b8 = 9;
        }
        local_b4 = local_b8;
      }
      local_1 = local_b4;
    }
  }
  else {
    local_1 = 8;
  }
  return local_1;
}

Assistant:

static uint8_t get_superres_denom_for_qindex(const AV1_COMP *cpi, int qindex,
                                             int sr_kf, int sr_arf) {
  // Use superres for Key-frames and Alt-ref frames only.
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE && !sr_kf) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE && !sr_arf) {
    return SCALE_NUMERATOR;
  }

  double energy[16];
  analyze_hor_freq(cpi, energy);

  const double energy_by_q2_thresh =
      get_energy_by_q2_thresh(gf_group, &cpi->rc, cpi->gf_frame_index);
  int denom = get_superres_denom_from_qindex_energy(
      qindex, energy, energy_by_q2_thresh, SUPERRES_ENERGY_BY_AC_THRESH);
  /*
  printf("\nenergy = [");
  for (int k = 1; k < 16; ++k) printf("%f, ", energy[k]);
  printf("]\n");
  printf("boost = %d\n",
         (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE)
             ? cpi->ppi->p_rc.kf_boost
             : cpi->rc.gfu_boost);
  printf("denom = %d\n", denom);
  */
  if (av1_superres_in_recode_allowed(cpi)) {
    assert(cpi->superres_mode != AOM_SUPERRES_NONE);
    // Force superres to be tried in the recode loop, as full-res is also going
    // to be tried anyway.
    denom = AOMMAX(denom, SCALE_NUMERATOR + 1);
  }
  return denom;
}